

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

ENDPOINT_INSTANCE *
find_session_endpoint_by_incoming_channel(CONNECTION_HANDLE connection,uint16_t incoming_channel)

{
  uint uVar1;
  LOGGER_LOG p_Var2;
  ulong uVar3;
  ENDPOINT_INSTANCE *pEVar4;
  
  uVar1 = connection->endpoint_count;
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (connection->endpoints[uVar3]->incoming_channel == incoming_channel) goto LAB_001114f1;
      uVar3 = uVar3 + 1;
    } while (uVar1 != (uint)uVar3);
    uVar3 = (ulong)uVar1;
  }
LAB_001114f1:
  if ((uint)uVar3 == uVar1) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pEVar4 = (ENDPOINT_INSTANCE *)0x0;
    }
    else {
      pEVar4 = (ENDPOINT_INSTANCE *)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"find_session_endpoint_by_incoming_channel",0x26b,1,
                "Cannot find session endpoint for channel %u",incoming_channel);
    }
  }
  else {
    pEVar4 = connection->endpoints[uVar3 & 0xffffffff];
  }
  return pEVar4;
}

Assistant:

static ENDPOINT_INSTANCE* find_session_endpoint_by_incoming_channel(CONNECTION_HANDLE connection, uint16_t incoming_channel)
{
    uint32_t i;
    ENDPOINT_INSTANCE* result;

    for (i = 0; i < connection->endpoint_count; i++)
    {
        if (connection->endpoints[i]->incoming_channel == incoming_channel)
        {
            break;
        }
    }

    if (i == connection->endpoint_count)
    {
        LogError("Cannot find session endpoint for channel %u", (unsigned int)incoming_channel);
        result = NULL;
    }
    else
    {
        result = connection->endpoints[i];
    }

    return result;
}